

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::CategoricalMapping::SharedDtor(CategoricalMapping *this)

{
  bool bVar1;
  Arena *pAVar2;
  LogMessage *other;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  CategoricalMapping *local_10;
  CategoricalMapping *this_local;
  
  local_10 = this;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  local_49 = 0;
  if (pAVar2 != (Arena *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/CategoricalMapping.pb.cc"
               ,0x9d);
    local_49 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  bVar1 = has_MappingType(this);
  if (bVar1) {
    clear_MappingType(this);
  }
  bVar1 = has_ValueOnUnknown(this);
  if (bVar1) {
    clear_ValueOnUnknown(this);
  }
  return;
}

Assistant:

inline void CategoricalMapping::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (has_MappingType()) {
    clear_MappingType();
  }
  if (has_ValueOnUnknown()) {
    clear_ValueOnUnknown();
  }
}